

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

ExtKeyType cfd::js::api::HDWalletStructApi::ConvertExtKeyType(string *key_type)

{
  bool bVar1;
  ExtKeyType EVar2;
  CfdException *this;
  allocator local_39;
  undefined1 local_38 [32];
  
  bVar1 = std::operator==(key_type,"extPrivkey");
  EVar2 = kExtPrivkey;
  if (!bVar1) {
    bVar1 = std::operator==(key_type,"extPubkey");
    if (!bVar1) {
      local_38._0_8_ = "cfdjs_hdwallet.cpp";
      local_38._8_4_ = 0x191;
      local_38._16_8_ = "ConvertExtKeyType";
      core::logger::warn<std::__cxx11::string_const&>
                ((CfdSourceLocation *)local_38,
                 "Failed to ExtKeyType. Invalid extkeyType passed: extkey_type={}",key_type);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_38,
                 "Invalid extkeyType passed. extkeyType must be \"extPrivkey\" or \"extPubkey\".",
                 &local_39);
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    EVar2 = kExtPubkey;
  }
  return EVar2;
}

Assistant:

ExtKeyType HDWalletStructApi::ConvertExtKeyType(const std::string& key_type) {
  ExtKeyType result;
  if (key_type == "extPrivkey") {
    result = ExtKeyType::kExtPrivkey;
  } else if (key_type == "extPubkey") {
    result = ExtKeyType::kExtPubkey;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ExtKeyType. Invalid extkeyType passed: "
        "extkey_type={}",  // NOLINT
        key_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid extkeyType passed. extkeyType must be "
        "\"extPrivkey\" or \"extPubkey\".");
  }
  return result;
}